

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

bool __thiscall
S2BooleanOperation::Impl::ProcessIncidentEdges
          (Impl *this,ShapeEdge *a,S2ContainsPointQuery<S2ShapeIndex> *query,CrossingProcessor *cp)

{
  pointer *ppIVar1;
  pointer pIVar2;
  ShapeEdgeId SVar3;
  ShapeEdgeId a_id;
  long lVar4;
  byte bVar5;
  int iVar6;
  undefined4 uVar7;
  ulong uVar8;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  _Var9;
  ShapeEdgeId SVar10;
  undefined4 extraout_var;
  iterator __position;
  CrossingIterator next_crossing;
  _Any_data local_60;
  code *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_34;
  
  pIVar2 = (this->tmp_crossings_).
           super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->tmp_crossings_).
      super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar2) {
    (this->tmp_crossings_).
    super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar2;
  }
  local_48 = std::
             _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:1851:37)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:1851:37)>
             ::_M_manager;
  local_60._M_unused._M_object = a;
  local_60._8_8_ = this;
  S2ContainsPointQuery<S2ShapeIndex>::VisitIncidentEdges
            (query,&(a->edge_).v0,(EdgeVisitor *)&local_60);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,3);
  }
  pIVar2 = (this->tmp_crossings_).
           super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->tmp_crossings_).
       super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar2 == __position._M_current) {
    bVar5 = cp->inside_ ^ 1;
  }
  else {
    uVar8 = ((long)__position._M_current - (long)pIVar2 >> 2) * -0x3333333333333333;
    if (1 < uVar8) {
      lVar4 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pIVar2,__position._M_current,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pIVar2,__position._M_current);
      _Var9 = std::
              __adjacent_find<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        ((this->tmp_crossings_).
                         super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->tmp_crossings_).
                         super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      __position._M_current =
           (this->tmp_crossings_).
           super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (_Var9._M_current != __position._M_current) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_60,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                   ,0x749,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_60._8_8_,
                   "Check failed: std::adjacent_find(tmp_crossings_.begin(), tmp_crossings_.end()) == tmp_crossings_.end() "
                   ,0x67);
        abort();
      }
    }
    SVar10 = kSentinel;
    local_60._M_unused._M_object = (void *)kSentinel;
    local_60._8_4_ = kSentinel.shape_id;
    local_60._12_4_ = kSentinel.edge_id;
    local_50 = (code *)((ulong)local_50 & 0xffffffffffffff00);
    if (__position._M_current ==
        (this->tmp_crossings_).
        super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
      ::_M_realloc_insert<S2BooleanOperation::Impl::IndexCrossing>
                (&this->tmp_crossings_,__position,(IndexCrossing *)&local_60);
      SVar10 = kSentinel;
    }
    else {
      *(undefined4 *)&(__position._M_current)->field_0x10 = local_50._0_4_;
      local_60._0_4_ = SVar10.shape_id;
      local_60._4_4_ = SVar10.edge_id;
      ((__position._M_current)->a).shape_id = local_60._0_4_;
      ((__position._M_current)->a).edge_id = local_60._4_4_;
      ((__position._M_current)->b).shape_id = local_60._0_4_;
      ((__position._M_current)->b).edge_id = local_60._4_4_;
      ppIVar1 = &(this->tmp_crossings_).
                 super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppIVar1 = *ppIVar1 + 1;
    }
    local_60._M_unused._M_object = query->index_;
    local_60._8_8_ =
         (this->tmp_crossings_).
         super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (code *)CONCAT44(local_48._4_4_,0xffffffff);
    local_34 = 0;
    SVar3.shape_id = (((pointer)local_60._8_8_)->a).shape_id;
    SVar3.edge_id = (((pointer)local_60._8_8_)->a).edge_id;
    if (SVar3 != SVar10) {
      iVar6 = (((pointer)local_60._8_8_)->b).shape_id;
      if (iVar6 != -1) {
        local_48 = (code *)CONCAT44(local_48._4_4_,iVar6);
        iVar6 = (*((S2ShapeIndex *)local_60._M_unused._0_8_)->_vptr_S2ShapeIndex[3])();
        local_50 = (code *)CONCAT44(extraout_var,iVar6);
        uVar7 = (**(code **)(*(long *)local_50 + 0x20))(local_50);
        local_48 = (code *)CONCAT44(uVar7,(undefined4)local_48);
        local_40 = 0xffffffff;
      }
    }
    a_id.shape_id = (a->id_).shape_id;
    a_id.edge_id = (a->id_).edge_id;
    bVar5 = CrossingProcessor::ProcessEdge(cp,a_id,(CrossingIterator *)&local_60);
  }
  return (bool)bVar5;
}

Assistant:

bool S2BooleanOperation::Impl::ProcessIncidentEdges(
    const ShapeEdge& a, S2ContainsPointQuery<S2ShapeIndex>* query,
    CrossingProcessor* cp) {
  tmp_crossings_.clear();
  query->VisitIncidentEdges(a.v0(), [&a, this](const ShapeEdge& b) {
      return AddIndexCrossing(a, b, false /*is_interior*/, &tmp_crossings_);
    });
  // Fast path for the common case where there are no incident edges.  We
  // return false (terminating early) if the first chain edge will be emitted.
  if (tmp_crossings_.empty()) {
    return !cp->inside();
  }
  // Otherwise we invoke the full CrossingProcessor logic to determine whether
  // the first chain edge will be emitted.
  if (tmp_crossings_.size() > 1) {
    std::sort(tmp_crossings_.begin(), tmp_crossings_.end());
    // VisitIncidentEdges() should not generate any duplicate values.
    S2_DCHECK(std::adjacent_find(tmp_crossings_.begin(), tmp_crossings_.end()) ==
           tmp_crossings_.end());
  }
  tmp_crossings_.push_back(IndexCrossing(kSentinel, kSentinel));
  CrossingIterator next_crossing(&query->index(), &tmp_crossings_,
                                 false /*crossings_complete*/);
  return cp->ProcessEdge(a.id(),  &next_crossing);
}